

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<long>
          (Deserializer *this,field_id_t field_id,char *tag,long *ret)

{
  ulong uVar1;
  type_conflict2 tVar2;
  type_conflict2 *in_RCX;
  undefined8 in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  
  uVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    tVar2 = SerializationDefaultValue::GetDefault<long>();
    *in_RCX = tVar2;
    (**(code **)(*in_RDI + 0x28))(in_RDI,0);
  }
  else {
    tVar2 = Read<long>((Deserializer *)0xaee7ac);
    *in_RCX = tVar2;
    (**(code **)(*in_RDI + 0x28))(in_RDI,1);
  }
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}